

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void aom_paeth_predictor_64x16_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 (*pauVar6) [16];
  int iVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  __m256i l16;
  __m256i t3;
  __m256i t2;
  __m256i t1;
  __m256i t0;
  __m256i tl;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  __m256i local_120;
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  __m256i local_80 [2];
  
  local_a0 = vpmovzxbw_avx(*(undefined1 (*) [16])above);
  local_90 = vpunpckhbw_avx(*(undefined1 (*) [16])above,(undefined1  [16])0x0);
  local_c0 = vpmovzxbw_avx(*(undefined1 (*) [16])(above + 0x10));
  local_b0 = vpunpckhbw_avx(*(undefined1 (*) [16])(above + 0x10),(undefined1  [16])0x0);
  local_e0 = vpmovzxbw_avx(*(undefined1 (*) [16])(above + 0x20));
  local_d0 = vpunpckhbw_avx(*(undefined1 (*) [16])(above + 0x20),(undefined1  [16])0x0);
  local_100 = vpmovzxbw_avx(*(undefined1 (*) [16])(above + 0x30));
  local_f0 = vpunpckhbw_avx(*(undefined1 (*) [16])(above + 0x30),(undefined1  [16])0x0);
  bVar1 = above[-1];
  local_80[0][0] = (ulong)CONCAT16(bVar1,(uint6)CONCAT14(bVar1,(uint)CONCAT12(bVar1,(ushort)bVar1)))
  ;
  local_80[0][1]._0_1_ = bVar1;
  local_80[0][1]._1_1_ = 0;
  local_80[0][1]._2_1_ = bVar1;
  local_80[0][1]._3_1_ = 0;
  local_80[0][1]._4_1_ = bVar1;
  local_80[0][1]._5_1_ = 0;
  local_80[0][1]._6_1_ = bVar1;
  local_80[0][1]._7_1_ = 0;
  local_80[0][2]._0_1_ = bVar1;
  local_80[0][2]._1_1_ = 0;
  local_80[0][2]._2_1_ = bVar1;
  local_80[0][2]._3_1_ = 0;
  local_80[0][2]._4_1_ = bVar1;
  local_80[0][2]._5_1_ = 0;
  local_80[0][2]._6_1_ = bVar1;
  local_80[0][2]._7_1_ = 0;
  local_80[0][3]._0_1_ = bVar1;
  local_80[0][3]._1_1_ = 0;
  local_80[0][3]._2_1_ = bVar1;
  local_80[0][3]._3_1_ = 0;
  local_80[0][3]._4_1_ = bVar1;
  local_80[0][3]._5_1_ = 0;
  local_80[0][3]._6_1_ = bVar1;
  local_80[0][3]._7_1_ = 0;
  uVar2 = *(undefined8 *)*(undefined1 (*) [16])(left + 0x10);
  uVar3 = *(undefined8 *)(left + 0x18);
  auVar5 = *(undefined1 (*) [16])(left + 0x10);
  auVar13._8_8_ = 0x8000800080008000;
  auVar13._0_8_ = 0x8000800080008000;
  auVar13._16_8_ = 0x8000800080008000;
  auVar13._24_8_ = 0x8000800080008000;
  pauVar6 = (undefined1 (*) [16])(dst + 0x30);
  iVar7 = 0x10;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    auVar4._16_8_ = uVar2;
    auVar4._0_16_ = auVar5;
    auVar4._24_8_ = uVar3;
    local_120 = (__m256i)vpshufb_avx2(auVar4,auVar13);
    auVar9 = local_120._0_16_;
    paeth_16x1_pred(&local_120,(__m256i *)local_a0,local_80);
    auVar10 = auVar9;
    paeth_16x1_pred(&local_120,(__m256i *)local_c0,local_80);
    auVar11 = auVar10;
    paeth_16x1_pred(&local_120,(__m256i *)local_e0,local_80);
    auVar12 = auVar11;
    paeth_16x1_pred(&local_120,(__m256i *)local_100,local_80);
    local_170 = auVar9._0_8_;
    uStack_168 = auVar9._8_8_;
    *(undefined8 *)pauVar6[-3] = local_170;
    *(undefined8 *)(pauVar6[-3] + 8) = uStack_168;
    local_180 = auVar10._0_8_;
    uStack_178 = auVar10._8_8_;
    *(undefined8 *)pauVar6[-2] = local_180;
    *(undefined8 *)(pauVar6[-2] + 8) = uStack_178;
    local_190 = auVar11._0_8_;
    uStack_188 = auVar11._8_8_;
    *(undefined8 *)pauVar6[-1] = local_190;
    *(undefined8 *)(pauVar6[-1] + 8) = uStack_188;
    *pauVar6 = auVar12;
    auVar13 = vpsubw_avx2(auVar13,_DAT_0046a240);
    pauVar6 = (undefined1 (*) [16])(*pauVar6 + stride);
  }
  return;
}

Assistant:

void aom_paeth_predictor_64x16_avx2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  const __m256i t0 = get_top_vector(above);
  const __m256i t1 = get_top_vector(above + 16);
  const __m256i t2 = get_top_vector(above + 32);
  const __m256i t3 = get_top_vector(above + 48);
  const __m256i tl = _mm256_set1_epi16((int16_t)above[-1]);
  const __m256i one = _mm256_set1_epi16(1);

  int i;
  const __m256i l = get_left_vector(left);
  __m256i rep = _mm256_set1_epi16((short)0x8000);
  for (i = 0; i < 16; ++i) {
    const __m256i l16 = _mm256_shuffle_epi8(l, rep);

    const __m128i r0 = paeth_16x1_pred(&l16, &t0, &tl);
    const __m128i r1 = paeth_16x1_pred(&l16, &t1, &tl);
    const __m128i r2 = paeth_16x1_pred(&l16, &t2, &tl);
    const __m128i r3 = paeth_16x1_pred(&l16, &t3, &tl);

    _mm_store_si128((__m128i *)dst, r0);
    _mm_store_si128((__m128i *)(dst + 16), r1);
    _mm_store_si128((__m128i *)(dst + 32), r2);
    _mm_store_si128((__m128i *)(dst + 48), r3);

    dst += stride;
    rep = _mm256_add_epi16(rep, one);
  }
}